

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int archive_read_format_ar_bid(archive_read *a,int best_bid)

{
  long *plVar1;
  void *h;
  int best_bid_local;
  archive_read *a_local;
  
  plVar1 = (long *)__archive_read_ahead(a,8,(ssize_t *)0x0);
  if (plVar1 == (long *)0x0) {
    a_local._4_4_ = -1;
  }
  else if (*plVar1 == 0xa3e686372613c21) {
    a_local._4_4_ = 0x40;
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_ar_bid(struct archive_read *a, int best_bid)
{
	const void *h;

	(void)best_bid; /* UNUSED */

	/*
	 * Verify the 8-byte file signature.
	 * TODO: Do we need to check more than this?
	 */
	if ((h = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);
	if (memcmp(h, "!<arch>\n", 8) == 0) {
		return (64);
	}
	return (-1);
}